

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::LookupSymbol
          (ElfMemImage *this,char *name,char *version,int type,SymbolInfo *info_out)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  SymbolIterator __begin2;
  SymbolIterator local_60;
  
  local_60.index_ = 0;
  local_60.image_ = this;
  SymbolIterator::Update(&local_60,0);
  uVar1 = this->num_syms_;
  bVar2 = local_60.index_ != uVar1 || (ElfMemImage *)local_60.image_ != this;
  if (local_60.index_ != uVar1 || (ElfMemImage *)local_60.image_ != this) {
    do {
      iVar3 = strcmp(local_60.info_.name,name);
      if (((iVar3 == 0) && (iVar3 = strcmp(local_60.info_.version,version), iVar3 == 0)) &&
         (((local_60.info_.symbol)->st_info & 0xf) == type)) {
        if (info_out == (SymbolInfo *)0x0) {
          return bVar2;
        }
        info_out->address = local_60.info_.address;
        info_out->symbol = local_60.info_.symbol;
        info_out->name = local_60.info_.name;
        info_out->version = local_60.info_.version;
        return bVar2;
      }
      SymbolIterator::Update(&local_60,1);
      bVar2 = local_60.index_ != uVar1 || (ElfMemImage *)local_60.image_ != this;
    } while (bVar2);
  }
  return bVar2;
}

Assistant:

bool ElfMemImage::LookupSymbol(const char *name,
                               const char *version,
                               int type,
                               SymbolInfo *info_out) const {
  for (const SymbolInfo& info : *this) {
    if (strcmp(info.name, name) == 0 && strcmp(info.version, version) == 0 &&
        ElfType(info.symbol) == type) {
      if (info_out) {
        *info_out = info;
      }
      return true;
    }
  }
  return false;
}